

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall
MipsParser::parseMacroParameters(MipsParser *this,Parser *parser,MipsMacroDefinition *macro)

{
  anon_struct_40_4_e71670ea_for_secondary *paVar1;
  byte symbol;
  bool bVar2;
  Token *pTVar3;
  MipsParser *dest;
  MipsParser *this_00;
  byte *pbVar4;
  
  pbVar4 = (byte *)macro->args;
  symbol = *pbVar4;
  if (symbol != 0) {
    this_00 = this;
    do {
      pbVar4 = pbVar4 + 1;
      if (symbol < 0x69) {
        paVar1 = &(this->immediate).secondary;
        if (symbol == 0x49) {
LAB_0016a490:
          bVar2 = parseImmediate(this_00,parser,&paVar1->expression);
        }
        else if (symbol == 0x53) {
          bVar2 = parseFpuRegister(this_00,parser,&(this->registers).frs);
        }
        else {
          dest = (MipsParser *)&(this->registers).grd;
          if (symbol == 100) goto LAB_0016a4b7;
LAB_0016a497:
          bVar2 = matchSymbol(this_00,parser,symbol);
        }
      }
      else {
        paVar1 = (anon_struct_40_4_e71670ea_for_secondary *)&(this->immediate).primary;
        if (symbol == 0x69) goto LAB_0016a490;
        dest = this;
        if ((symbol != 0x73) && (dest = (MipsParser *)&(this->registers).grt, symbol != 0x74))
        goto LAB_0016a497;
LAB_0016a4b7:
        bVar2 = parseRegister(this_00,parser,(MipsRegisterValue *)dest);
      }
      if (bVar2 == false) {
        return false;
      }
      symbol = *pbVar4;
    } while (symbol != 0);
  }
  bVar2 = false;
  pTVar3 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar3->type != LParen) {
    pTVar3 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar2 = pTVar3->type == Separator;
  }
  return bVar2;
}

Assistant:

bool MipsParser::parseMacroParameters(Parser& parser, const MipsMacroDefinition& macro)
{
	const char* encoding = macro.args;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'S':	// register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			break;
		case 'I':	// secondary immediate
			CHECK(parseImmediate(parser,immediate.secondary.expression));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	// lw rx,imm is a prefix of lw rx,imm(ry)
	if (parser.peekToken().type == TokenType::LParen)
		return false;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}